

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O2

void anon_unknown.dwarf_29cb3c::writeCopyRead(string *tempDir,int w,int h,int xs,int ys)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  Rand32 RVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ostream *poVar19;
  uint *puVar20;
  undefined4 *puVar21;
  char *pcVar22;
  int *piVar23;
  Box<Imath_3_2::Vec2<int>_> *pBVar24;
  Box<Imath_3_2::Vec2<int>_> *pBVar25;
  float *pfVar26;
  float *pfVar27;
  ChannelList *pCVar28;
  ChannelList *pCVar29;
  uint uVar30;
  half *phVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int tileY;
  ulong uVar35;
  pointer piVar36;
  int tileX_1;
  int tileX_3;
  int iVar37;
  long lVar38;
  ulong uVar39;
  int tileX;
  long lVar40;
  long lVar41;
  Array2D<Imath_3_2::half> *this;
  long lVar42;
  int tileY_3;
  ulong uVar43;
  float fVar44;
  vector<int,_std::allocator<int>_> tileXs;
  vector<int,_std::allocator<int>_> tileYs;
  int local_198;
  FrameBuffer fb;
  TiledOutputFile out;
  allocator_type local_111;
  ulong local_110;
  Rand32 rand1;
  Rand32 rand1_2;
  Array2D<Imath_3_2::half> ph1;
  Rand32 rand1_1;
  Header hdr;
  string filename;
  
  std::operator+(&filename,tempDir,"imf_test_copy.exr");
  uVar30 = 0;
  do {
    if (uVar30 == 10) {
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    if ((uVar30 & 0xe) != 6) {
      for (uVar7 = 0; uVar7 != 2; uVar7 = uVar7 + 1) {
        for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
          for (iVar34 = 0; iVar34 != 2; iVar34 = iVar34 + 1) {
            for (iVar33 = 0; _Var4._M_p = filename._M_dataplus._M_p, iVar33 != 2;
                iVar33 = iVar33 + 1) {
              poVar19 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
              poVar19 = std::operator<<(poVar19,", buffer ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", seek ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", levelMode 0, ");
              poVar19 = std::operator<<(poVar19,"roundingMode ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar8);
              poVar19 = std::operator<<(poVar19,", compression ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
              std::endl<char,std::char_traits<char>>(poVar19);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar20 = (uint *)Imf_3_2::Header::compression();
              *puVar20 = uVar30;
              puVar21 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar21 = 0;
              pcVar22 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1abe24);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              ph1._sizeX = 0x103;
              ph1._sizeY = 0xab;
              ph1._data = (half *)operator_new__(0x15a02);
              fillPixels(&ph1,0xab,0x103);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,(char *)ph1._data,2,0x156,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar9 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var4._M_p,&hdr,iVar9);
              Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
              rand1._state = (unsigned_long)&DAT_5a5a5a5a;
              iVar9 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)iVar9,(allocator_type *)&tileXs);
              iVar9 = Imf_3_2::TiledOutputFile::numXTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar9,(allocator_type *)&rand1_1);
              iVar9 = -1;
              for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                  lVar40 < iVar10; lVar40 = lVar40 + 1) {
                if (uVar7 == 1) {
                  iVar10 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar10 + iVar9] = (int)lVar40;
                }
                else {
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar40] = (int)lVar40;
                }
                iVar9 = iVar9 + -1;
              }
              for (lVar40 = 0; iVar9 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                  lVar40 < iVar9; lVar40 = lVar40 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar40] = (int)lVar40;
              }
              if (iVar34 != 0) {
                for (lVar40 = 0; iVar9 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                    piVar36 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar40 < iVar9; lVar40 = lVar40 + 1)
                {
                  iVar9 = Imf_3_2::TiledOutputFile::numYTiles((int)&out);
                  fVar44 = Imath_3_2::Rand32::nextf(&rand1,(float)(int)lVar40,(float)(iVar9 + -1));
                  iVar9 = piVar36[lVar40];
                  piVar36[lVar40] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)] = iVar9;
                }
                for (lVar40 = 0; iVar9 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                    piVar36 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar40 < iVar9; lVar40 = lVar40 + 1)
                {
                  iVar9 = Imf_3_2::TiledOutputFile::numXTiles((int)&out);
                  fVar44 = Imath_3_2::Rand32::nextf(&rand1,(float)(int)lVar40,(float)(iVar9 + -1));
                  iVar9 = piVar36[lVar40];
                  piVar36[lVar40] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)] = iVar9;
                }
              }
              for (lVar40 = 0; iVar9 = Imf_3_2::TiledOutputFile::numYTiles((int)&out),
                  lVar40 < iVar9; lVar40 = lVar40 + 1) {
                for (lVar41 = 0; iVar9 = Imf_3_2::TiledOutputFile::numXTiles((int)&out),
                    lVar41 < iVar9; lVar41 = lVar41 + 1) {
                  Imf_3_2::TiledOutputFile::writeTile
                            ((int)&out,
                             tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar41],
                             tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar40]);
                }
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileYs.super__Vector_base<int,_std::allocator<int>_>);
              Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar9 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&tileXs,_Var4._M_p,iVar9);
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::dataWindow();
              iVar9 = *piVar23;
              lVar41 = (long)piVar23[2] - (long)iVar9;
              lVar40 = lVar41 + 1;
              iVar10 = piVar23[1];
              lVar38 = (long)piVar23[3] - (long)iVar10;
              Imf_3_2::Array2D<Imath_3_2::half>::Array2D
                        ((Array2D<Imath_3_2::half> *)&tileYs,lVar38 + 1,lVar40);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_end_of_storage +
                                 (long)iVar9 * -2 +
                                 -(long)iVar10 *
                                 (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish * 2),2,lVar40 * 2,1,1,0.0,
                         false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileXs);
              uVar11 = (uint)(iVar33 == 0);
              if (uVar7 == uVar11) {
                iVar10 = Imf_3_2::TiledInputFile::numYTiles((int)&tileXs);
                iVar10 = iVar10 + -1;
                iVar9 = -1;
                iVar13 = -1;
              }
              else {
                iVar10 = 0;
                iVar13 = Imf_3_2::TiledInputFile::numYTiles((int)&tileXs);
                iVar9 = 1;
              }
              for (; iVar10 != iVar13; iVar10 = iVar10 + iVar9) {
                for (iVar14 = 0; iVar15 = Imf_3_2::TiledInputFile::numXTiles((int)&tileXs),
                    iVar14 < iVar15; iVar14 = iVar14 + 1) {
                  Imf_3_2::TiledInputFile::readTile((int)&tileXs,iVar14,iVar10);
                }
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb7,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb8,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb9,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar27 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar26 != *pfVar27) || (NAN(*pfVar26) || NAN(*pfVar27))) ||
                  (pfVar26[1] != pfVar27[1])) || (NAN(pfVar26[1]) || NAN(pfVar27[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbb,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbc,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              iVar9 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar9 != *piVar23) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbd,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::compression();
              iVar9 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::compression();
              if (iVar9 != *piVar23) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbe,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar28 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar29 = (ChannelList *)Imf_3_2::Header::channels();
              cVar6 = Imf_3_2::ChannelList::operator==(pCVar28,pCVar29);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbf,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              local_198 = (int)lVar41;
              phVar31 = ph1._data;
              piVar36 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              for (lVar40 = 0; lVar40 <= (int)lVar38; lVar40 = lVar40 + 1) {
                lVar41 = 0;
                while (lVar41 <= local_198) {
                  fVar44 = *(float *)(_imath_half_to_float_table + (ulong)phVar31[lVar41]._h * 4);
                  lVar42 = lVar41 * 2;
                  lVar41 = lVar41 + 1;
                  pfVar26 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)((long)piVar36 + lVar42) * 4);
                  if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                    __assert_fail("ph1[y][x] == ph2[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                  ,0xc3,
                                  "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                 );
                  }
                }
                piVar36 = (pointer)((long)piVar36 +
                                   (long)tileYs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish * 2);
                phVar31 = phVar31 + ph1._sizeY;
              }
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&tileYs);
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileXs);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&ph1);
              Imf_3_2::Header::~Header(&hdr);
              _Var4 = filename._M_dataplus;
              poVar19 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
              poVar19 = std::operator<<(poVar19,", buffer ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", seek ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", levelMode 1, ");
              poVar19 = std::operator<<(poVar19,"roundingMode ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar8);
              poVar19 = std::operator<<(poVar19,", compression ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
              std::endl<char,std::char_traits<char>>(poVar19);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar20 = (uint *)Imf_3_2::Header::compression();
              *puVar20 = uVar30;
              puVar21 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar21 = 0;
              pcVar22 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1abe24);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              rand1._state = 0;
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar9 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&ph1,_Var4._M_p,&hdr,iVar9);
              uVar12 = Imf_3_2::TiledOutputFile::numLevels();
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::resizeErase
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&rand1,(long)(int)uVar12);
              rand1_1._state = (unsigned_long)&DAT_5a5a5a5a;
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)(int)uVar12,(allocator_type *)&out);
              uVar39 = 0;
              if (0 < (int)uVar12) {
                uVar39 = (ulong)uVar12;
              }
              for (uVar32 = 0; uVar39 != uVar32; uVar32 = uVar32 + 1) {
                tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar32] = (int)uVar32;
              }
              if (iVar34 != 0) {
                for (uVar32 = 0;
                    piVar36 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, uVar39 != uVar32;
                    uVar32 = uVar32 + 1) {
                  fVar44 = Imath_3_2::Rand32::nextf
                                     (&rand1_1,(float)(int)uVar32,(float)(int)(uVar12 - 1));
                  iVar9 = piVar36[uVar32];
                  piVar36[uVar32] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)] = iVar9;
                }
              }
              for (uVar32 = 0; iVar9 = (int)(Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)&ph1,
                  uVar32 != uVar39; uVar32 = uVar32 + 1) {
                iVar10 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar32];
                iVar13 = Imf_3_2::TiledOutputFile::levelWidth(iVar9);
                iVar14 = Imf_3_2::TiledOutputFile::levelHeight(iVar9);
                this = (Array2D<Imath_3_2::half> *)((long)iVar10 * 0x18);
                Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(this,(long)iVar14,(long)iVar13);
                fillPixels(this,iVar13,iVar14);
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_2::Slice::Slice
                          ((Slice *)&out,HALF,(char *)this->_data,2,(long)iVar13 * 2,1,1,0.0,false,
                           false);
                Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
                Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&ph1);
                iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&out,(long)iVar10,
                           (allocator_type *)&tileXs);
                iVar10 = Imf_3_2::TiledOutputFile::numXTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          (&tileXs,(long)iVar10,(allocator_type *)&rand1_2);
                iVar10 = -1;
                for (lVar40 = 0; iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                    lVar40 < iVar13; lVar40 = lVar40 + 1) {
                  if (uVar7 == 1) {
                    iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                    *(int *)(_out + (long)(iVar13 + iVar10) * 4) = (int)lVar40;
                  }
                  else {
                    *(int *)(_out + lVar40 * 4) = (int)lVar40;
                  }
                  iVar10 = iVar10 + -1;
                }
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                    lVar40 < iVar10; lVar40 = lVar40 + 1) {
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar40] = (int)lVar40;
                }
                if (iVar34 != 0) {
                  for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                      puVar2 = _out, lVar40 < iVar10; lVar40 = lVar40 + 1) {
                    iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                    fVar44 = Imath_3_2::Rand32::nextf
                                       (&rand1_1,(float)(int)lVar40,(float)(iVar10 + -1));
                    uVar1 = *(undefined4 *)(puVar2 + lVar40 * 4);
                    *(undefined4 *)(puVar2 + lVar40 * 4) =
                         *(undefined4 *)(_out + (long)(int)(fVar44 + 0.5) * 4);
                    *(undefined4 *)(_out + (long)(int)(fVar44 + 0.5) * 4) = uVar1;
                  }
                  for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                      piVar36 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start, lVar40 < iVar10;
                      lVar40 = lVar40 + 1) {
                    iVar10 = Imf_3_2::TiledOutputFile::numXTiles(iVar9);
                    fVar44 = Imath_3_2::Rand32::nextf
                                       (&rand1_1,(float)(int)lVar40,(float)(iVar10 + -1));
                    iVar10 = piVar36[lVar40];
                    piVar36[lVar40] =
                         tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)];
                    tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)] = iVar10;
                  }
                }
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                    lVar40 < iVar10; lVar40 = lVar40 + 1) {
                  for (lVar41 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                      lVar41 < iVar10; lVar41 = lVar41 + 1) {
                    Imf_3_2::TiledOutputFile::writeTile
                              (iVar9,tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar41],
                               *(int *)(_out + lVar40 * 4));
                  }
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&out);
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                             *)&fb);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileYs.super__Vector_base<int,_std::allocator<int>_>);
              Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&ph1);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar10 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,_Var4._M_p,iVar10);
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::dataWindow();
              iVar10 = *piVar23;
              iVar13 = piVar23[1];
              local_110 = Imf_3_2::TiledInputFile::numLevels();
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs,(long)(int)local_110);
              for (lVar40 = 0; iVar14 = Imf_3_2::TiledInputFile::numLevels(), lVar40 < iVar14;
                  lVar40 = lVar40 + 1) {
                iVar14 = Imf_3_2::TiledInputFile::levelWidth(iVar9);
                iVar15 = Imf_3_2::TiledInputFile::levelHeight(iVar9);
                Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
                          ((Array2D<Imath_3_2::half> *)
                           (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + lVar40 * 6),(long)iVar15,
                           (long)iVar14);
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_2::Slice::Slice
                          ((Slice *)&out,HALF,
                           (char *)(*(long *)(tileYs.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish +
                                             lVar40 * 6 + 2) * -(long)iVar13 * 2 +
                                    *(long *)(tileYs.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish +
                                             lVar40 * 6 + 4) + (long)iVar10 * -2),2,(long)iVar14 * 2
                           ,1,1,0.0,false,false);
                Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
                Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph1);
                if (uVar7 == uVar11) {
                  iVar15 = Imf_3_2::TiledInputFile::numYTiles(iVar9);
                  iVar15 = iVar15 + -1;
                  iVar14 = -1;
                  iVar16 = -1;
                }
                else {
                  iVar16 = Imf_3_2::TiledInputFile::numYTiles(iVar9);
                  iVar15 = 0;
                  iVar14 = 1;
                }
                for (; iVar15 != iVar16; iVar15 = iVar15 + iVar14) {
                  for (iVar37 = 0; iVar17 = Imf_3_2::TiledInputFile::numXTiles(iVar9),
                      iVar37 < iVar17; iVar37 = iVar37 + 1) {
                    Imf_3_2::TiledInputFile::readTile(iVar9,iVar37,iVar15);
                  }
                }
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                             *)&fb);
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17b,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17c,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar27 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar26 != *pfVar27) || (NAN(*pfVar26) || NAN(*pfVar27))) ||
                  (pfVar26[1] != pfVar27[1])) || (NAN(pfVar26[1]) || NAN(pfVar27[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17f,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x180,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              iVar10 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar10 != *piVar23) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x181,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::compression();
              iVar10 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::compression();
              if (iVar10 != *piVar23) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x182,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar28 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar29 = (ChannelList *)Imf_3_2::Header::channels();
              cVar6 = Imf_3_2::ChannelList::operator==(pCVar28,pCVar29);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x183,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              uVar39 = local_110 & 0xffffffff;
              if ((int)local_110 < 1) {
                uVar39 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar39; uVar32 = uVar32 + 1) {
                lVar41 = 0;
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledInputFile::levelHeight(iVar9),
                    lVar40 < iVar10; lVar40 = lVar40 + 1) {
                  lVar38 = 0;
                  while (iVar10 = Imf_3_2::TiledInputFile::levelWidth(iVar9), lVar38 < iVar10) {
                    fVar44 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               (*(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  uVar32 * 6 + 2) * lVar41 +
                                                *(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  uVar32 * 6 + 4) + lVar38 * 2) * 4);
                    lVar42 = lVar38 * 2;
                    lVar38 = lVar38 + 1;
                    pfVar26 = (float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               (*(long *)(uVar32 * 0x18 + 8) * lVar41 +
                                                *(long *)(uVar32 * 0x18 + 0x10) + lVar42) * 4);
                    if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                      __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                    ,0x188,
                                    "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                   );
                    }
                  }
                  lVar41 = lVar41 + 2;
                }
              }
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs);
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&rand1);
              Imf_3_2::Header::~Header(&hdr);
              _Var4 = filename._M_dataplus;
              poVar19 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
              poVar19 = std::operator<<(poVar19,", buffer ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", seek ");
              poVar19 = std::ostream::_M_insert<bool>(SUB81(poVar19,0));
              poVar19 = std::operator<<(poVar19,", levelMode 2, ");
              poVar19 = std::operator<<(poVar19,"roundingMode ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar8);
              poVar19 = std::operator<<(poVar19,", compression ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
              std::endl<char,std::char_traits<char>>(poVar19);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              ph1._sizeX = 0;
              Imf_3_2::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph1,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar20 = (uint *)Imf_3_2::Header::compression();
              *puVar20 = uVar30;
              puVar21 = (undefined4 *)Imf_3_2::Header::lineOrder();
              *puVar21 = 0;
              pcVar22 = (char *)Imf_3_2::Header::channels();
              Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1abe24);
              _out = &DAT_3700000037;
              Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar10 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&ph1,_Var4._M_p,&hdr,iVar10);
              iVar10 = Imf_3_2::TiledOutputFile::numYLevels();
              iVar13 = Imf_3_2::TiledOutputFile::numXLevels();
              Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::resizeErase
                        ((Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs,(long)iVar10,
                         (long)iVar13);
              rand1_2._state = (unsigned_long)&DAT_5a5a5a5a;
              iVar10 = Imf_3_2::TiledOutputFile::numXLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar10,(allocator_type *)&out);
              iVar10 = Imf_3_2::TiledOutputFile::numYLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&rand1,(long)iVar10,
                         (allocator_type *)&out);
              for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXLevels(), lVar40 < iVar10;
                  lVar40 = lVar40 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar40] = (int)lVar40;
              }
              for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYLevels(), lVar40 < iVar10;
                  lVar40 = lVar40 + 1) {
                *(int *)(rand1._state + lVar40 * 4) = (int)lVar40;
              }
              if (iVar34 != 0) {
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXLevels(),
                    piVar36 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar40 < iVar10; lVar40 = lVar40 + 1
                    ) {
                  iVar10 = Imf_3_2::TiledOutputFile::numXLevels();
                  fVar44 = Imath_3_2::Rand32::nextf
                                     (&rand1_2,(float)(int)lVar40,(float)(iVar10 + -1));
                  iVar10 = piVar36[lVar40];
                  piVar36[lVar40] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar44 + 0.5)] = iVar10;
                }
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYLevels(), RVar3 = rand1,
                    lVar40 < iVar10; lVar40 = lVar40 + 1) {
                  iVar10 = Imf_3_2::TiledOutputFile::numYLevels();
                  fVar44 = Imath_3_2::Rand32::nextf
                                     (&rand1_2,(float)(int)lVar40,(float)(iVar10 + -1));
                  uVar1 = *(undefined4 *)(RVar3._state + lVar40 * 4);
                  *(undefined4 *)(RVar3._state + lVar40 * 4) =
                       *(undefined4 *)(rand1._state + (long)(int)(fVar44 + 0.5) * 4);
                  *(undefined4 *)(rand1._state + (long)(int)(fVar44 + 0.5) * 4) = uVar1;
                }
              }
              uVar39 = 0;
              while (iVar10 = Imf_3_2::TiledOutputFile::numYLevels(), (long)uVar39 < (long)iVar10) {
                iVar10 = *(int *)(rand1._state + uVar39 * 4);
                local_110 = uVar39;
                iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&rand1_1,(long)iVar13,
                           (allocator_type *)&out);
                lVar41 = (long)iVar10;
                iVar10 = -1;
                for (lVar40 = 0; iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                    lVar40 < iVar13; lVar40 = lVar40 + 1) {
                  if (uVar7 == 1) {
                    iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                    *(int *)(rand1_1._state + (long)(iVar13 + iVar10) * 4) = (int)lVar40;
                  }
                  else {
                    *(int *)(rand1_1._state + lVar40 * 4) = (int)lVar40;
                  }
                  iVar10 = iVar10 + -1;
                }
                if (iVar34 != 0) {
                  for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                      RVar3 = rand1_1, lVar40 < iVar10; lVar40 = lVar40 + 1) {
                    iVar10 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
                    fVar44 = Imath_3_2::Rand32::nextf
                                       (&rand1_2,(float)(int)lVar40,(float)(iVar10 + -1));
                    uVar1 = *(undefined4 *)(RVar3._state + lVar40 * 4);
                    *(undefined4 *)(RVar3._state + lVar40 * 4) =
                         *(undefined4 *)(rand1_1._state + (long)(int)(fVar44 + 0.5) * 4);
                    *(undefined4 *)(rand1_1._state + (long)(int)(fVar44 + 0.5) * 4) = uVar1;
                  }
                }
                for (lVar40 = 0; iVar10 = Imf_3_2::TiledOutputFile::numXLevels(), lVar40 < iVar10;
                    lVar40 = lVar40 + 1) {
                  iVar10 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar40];
                  iVar13 = Imf_3_2::TiledOutputFile::levelWidth(iVar9);
                  iVar14 = Imf_3_2::TiledOutputFile::levelHeight(iVar9);
                  lVar38 = (long)iVar10;
                  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
                            ((Array2D<Imath_3_2::half> *)
                             (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                             (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish * lVar41 * 6 + lVar38 * 6),
                             (long)iVar14,(long)iVar13);
                  fillPixels((Array2D<Imath_3_2::half> *)
                             (tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                             (long)tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish * lVar41 * 6 + lVar38 * 6),
                             iVar13,iVar14);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_2::Slice::Slice
                            ((Slice *)&out,HALF,
                             *(char **)(tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_end_of_storage +
                                       (long)tileYs.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish * lVar41 * 6
                                       + lVar38 * 6 + 4),2,(long)iVar13 * 2,1,1,0.0,false,false);
                  Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
                  Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&ph1);
                  iVar13 = Imf_3_2::TiledOutputFile::numXTiles(iVar9);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar13,&local_111);
                  for (lVar38 = 0; iVar13 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                      lVar38 < iVar13; lVar38 = lVar38 + 1) {
                    *(int *)(_out + lVar38 * 4) = (int)lVar38;
                  }
                  if (iVar34 != 0) {
                    for (lVar38 = 0; iVar13 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                        puVar2 = _out, lVar38 < iVar13; lVar38 = lVar38 + 1) {
                      iVar13 = Imf_3_2::TiledOutputFile::numXTiles(iVar9);
                      fVar44 = Imath_3_2::Rand32::nextf
                                         (&rand1_2,(float)(int)lVar38,(float)(iVar13 + -1));
                      uVar1 = *(undefined4 *)(puVar2 + lVar38 * 4);
                      *(undefined4 *)(puVar2 + lVar38 * 4) =
                           *(undefined4 *)(_out + (long)(int)(fVar44 + 0.5) * 4);
                      *(undefined4 *)(_out + (long)(int)(fVar44 + 0.5) * 4) = uVar1;
                    }
                  }
                  for (lVar38 = 0; iVar13 = Imf_3_2::TiledOutputFile::numYTiles(iVar9),
                      lVar38 < iVar13; lVar38 = lVar38 + 1) {
                    for (lVar42 = 0; iVar13 = Imf_3_2::TiledOutputFile::numXTiles(iVar9),
                        lVar42 < iVar13; lVar42 = lVar42 + 1) {
                      Imf_3_2::TiledOutputFile::writeTile
                                (iVar9,*(int *)(_out + lVar42 * 4),
                                 *(int *)(rand1_1._state + lVar38 * 4),iVar10);
                    }
                  }
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                            ((_Vector_base<int,_std::allocator<int>_> *)&out);
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)&fb);
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&rand1_1);
                uVar39 = local_110 + 1;
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&rand1);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
              Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&ph1);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar9 = Imf_3_2::globalThreadCount();
              Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&tileXs,_Var4._M_p,iVar9);
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::dataWindow();
              iVar9 = *piVar23;
              iVar10 = piVar23[1];
              uVar12 = Imf_3_2::TiledInputFile::numXLevels();
              uVar18 = Imf_3_2::TiledInputFile::numYLevels();
              uVar39 = (ulong)uVar18;
              Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::Array2D
                        ((Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)&ph1,(long)(int)uVar18,
                         (long)(int)uVar12);
              for (lVar40 = 0; iVar13 = Imf_3_2::TiledInputFile::numYLevels(), lVar40 < iVar13;
                  lVar40 = lVar40 + 1) {
                if (uVar7 == uVar11) {
                  iVar13 = Imf_3_2::TiledInputFile::numYTiles((int)&tileXs);
                  local_110 = CONCAT44(local_110._4_4_,iVar13 + -1);
                  iVar14 = -1;
                  iVar13 = iVar14;
                }
                else {
                  iVar13 = Imf_3_2::TiledInputFile::numYTiles((int)&tileXs);
                  local_110 = local_110 & 0xffffffff00000000;
                  iVar14 = 1;
                }
                for (lVar41 = 0; iVar15 = Imf_3_2::TiledInputFile::numXLevels(), lVar41 < iVar15;
                    lVar41 = lVar41 + 1) {
                  iVar15 = Imf_3_2::TiledInputFile::levelWidth((int)&tileXs);
                  iVar16 = Imf_3_2::TiledInputFile::levelHeight((int)&tileXs);
                  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
                            ((Array2D<Imath_3_2::half> *)
                             (ph1._data + ph1._sizeY * lVar40 * 0xc + lVar41 * 0xc),(long)iVar16,
                             (long)iVar15);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_2::Slice::Slice
                            ((Slice *)&out,HALF,
                             (char *)(*(long *)(ph1._data +
                                               ph1._sizeY * lVar40 * 0xc + lVar41 * 0xc + 4) *
                                      -(long)iVar10 * 2 +
                                      *(long *)(ph1._data +
                                               ph1._sizeY * lVar40 * 0xc + lVar41 * 0xc + 8) +
                                     (long)iVar9 * -2),2,(long)iVar15 * 2,1,1,0.0,false,false);
                  Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1abe24);
                  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileXs);
                  for (iVar15 = (int)local_110; iVar15 != iVar13; iVar15 = iVar15 + iVar14) {
                    for (iVar16 = 0; iVar37 = Imf_3_2::TiledInputFile::numXTiles((int)&tileXs),
                        iVar16 < iVar37; iVar16 = iVar16 + 1) {
                      Imf_3_2::TiledInputFile::readTile((int)&tileXs,iVar16,iVar15,(int)lVar41);
                    }
                  }
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)&fb);
                }
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,600,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x259,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::pixelAspectRatio();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25a,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowCenter();
              pfVar27 = (float *)Imf_3_2::Header::screenWindowCenter();
              if ((((*pfVar26 != *pfVar27) || (NAN(*pfVar26) || NAN(*pfVar27))) ||
                  (pfVar26[1] != pfVar27[1])) || (NAN(pfVar26[1]) || NAN(pfVar27[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25c,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              fVar44 = *pfVar26;
              pfVar26 = (float *)Imf_3_2::Header::screenWindowWidth();
              if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25d,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              iVar9 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::lineOrder();
              if (iVar9 != *piVar23) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25e,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              piVar23 = (int *)Imf_3_2::Header::compression();
              iVar9 = *piVar23;
              piVar23 = (int *)Imf_3_2::Header::compression();
              if (iVar9 != *piVar23) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25f,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_2::TiledInputFile::header();
              pCVar28 = (ChannelList *)Imf_3_2::Header::channels();
              pCVar29 = (ChannelList *)Imf_3_2::Header::channels();
              cVar6 = Imf_3_2::ChannelList::operator==(pCVar28,pCVar29);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x260,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              uVar32 = (ulong)uVar12;
              if ((int)uVar12 < 1) {
                uVar32 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar39 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar39; uVar35 = uVar35 + 1) {
                for (uVar43 = 0; uVar43 != uVar32; uVar43 = uVar43 + 1) {
                  lVar40 = 0;
                  for (lVar41 = 0; iVar9 = Imf_3_2::TiledInputFile::levelHeight((int)&tileXs),
                      lVar41 < iVar9; lVar41 = lVar41 + 1) {
                    lVar38 = 0;
                    while (iVar9 = Imf_3_2::TiledInputFile::levelWidth((int)&tileXs), lVar38 < iVar9
                          ) {
                      fVar44 = *(float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(ph1._data +
                                                           ph1._sizeY * uVar35 * 0xc +
                                                           uVar43 * 0xc + 4) * lVar40 +
                                                  *(long *)(ph1._data +
                                                           ph1._sizeY * uVar35 * 0xc +
                                                           uVar43 * 0xc + 8) + lVar38 * 2) * 4);
                      lVar42 = lVar38 * 2;
                      lVar38 = lVar38 + 1;
                      pfVar26 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + (long)tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * uVar35
                                                  * 6 + uVar43 * 6 + 2) * lVar40 +
                                                  *(long *)(tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + (long)tileYs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * uVar35
                                                  * 6 + uVar43 * 6 + 4) + lVar42) * 4);
                      if ((fVar44 != *pfVar26) || (NAN(fVar44) || NAN(*pfVar26))) {
                        __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0x267,
                                      "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                    }
                    lVar40 = lVar40 + 2;
                  }
                }
              }
              Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array2D
                        ((Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)&ph1);
              Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileXs);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array2D
                        ((Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)&tileYs);
              Imf_3_2::Header::~Header(&hdr);
            }
          }
        }
      }
    }
    uVar30 = uVar30 + 1;
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string& tempDir, int w, int h, int xs, int ys)
{
    std::string filename = tempDir + "imf_test_copy.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION) { continue; }

        for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
        {
            for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
            {
                for (int tb = 0; tb <= 1; ++tb)
                {
                    for (int ts = 0; ts <= 1; ++ts)
                    {
                        writeCopyReadONE (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadMIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadRIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);
                    }
                }
            }
        }
    }
}